

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.cc
# Opt level: O3

int do_dsa_print(BIO *bp,DSA *x,int off,int ptype)

{
  int iVar1;
  uint uVar2;
  BIGNUM *pBVar3;
  BIGNUM *num;
  BIGNUM *a;
  char *pcVar4;
  char *pcVar5;
  
  if (ptype == 2) {
    pBVar3 = DSA_get0_priv_key(x);
  }
  else {
    pBVar3 = (BIGNUM *)0x0;
    num = (BIGNUM *)0x0;
    if (ptype < 1) goto LAB_00226910;
  }
  num = DSA_get0_pub_key(x);
LAB_00226910:
  iVar1 = BIO_indent((BIO *)bp,off,0x80);
  if (iVar1 != 0) {
    pcVar4 = "DSA-Parameters";
    if (ptype == 1) {
      pcVar4 = "Public-Key";
    }
    pcVar5 = "Private-Key";
    if (ptype != 2) {
      pcVar5 = pcVar4;
    }
    a = (BIGNUM *)DSA_get0_p(x);
    uVar2 = BN_num_bits(a);
    iVar1 = BIO_printf((BIO *)bp,"%s: (%u bit)\n",pcVar5,(ulong)uVar2);
    if (0 < iVar1) {
      iVar1 = bn_print(bp,"priv:",pBVar3,off);
      if (iVar1 != 0) {
        iVar1 = bn_print(bp,"pub:",num,off);
        if (iVar1 != 0) {
          pBVar3 = DSA_get0_p(x);
          iVar1 = bn_print(bp,"P:",pBVar3,off);
          if (iVar1 != 0) {
            pBVar3 = DSA_get0_q(x);
            iVar1 = bn_print(bp,"Q:",pBVar3,off);
            if (iVar1 != 0) {
              pBVar3 = DSA_get0_g(x);
              iVar1 = bn_print(bp,"G:",pBVar3,off);
              return iVar1;
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

static int do_dsa_print(BIO *bp, const DSA *x, int off, int ptype) {
  const BIGNUM *priv_key = NULL;
  if (ptype == 2) {
    priv_key = DSA_get0_priv_key(x);
  }

  const BIGNUM *pub_key = NULL;
  if (ptype > 0) {
    pub_key = DSA_get0_pub_key(x);
  }

  const char *ktype = "DSA-Parameters";
  if (ptype == 2) {
    ktype = "Private-Key";
  } else if (ptype == 1) {
    ktype = "Public-Key";
  }

  if (!BIO_indent(bp, off, 128) ||
      BIO_printf(bp, "%s: (%u bit)\n", ktype, BN_num_bits(DSA_get0_p(x))) <=
          0 ||
      // |priv_key| and |pub_key| may be NULL, in which case |bn_print| will
      // silently skip them.
      !bn_print(bp, "priv:", priv_key, off) ||
      !bn_print(bp, "pub:", pub_key, off) ||
      !bn_print(bp, "P:", DSA_get0_p(x), off) ||
      !bn_print(bp, "Q:", DSA_get0_q(x), off) ||
      !bn_print(bp, "G:", DSA_get0_g(x), off)) {
    return 0;
  }

  return 1;
}